

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

bool __thiscall VmaDedicatedAllocationList::IsEmpty(VmaDedicatedAllocationList *this)

{
  bool bVar1;
  long in_RDI;
  VmaMutexLockRead lock;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffe4;
  VmaRWMutex *in_stack_ffffffffffffffe8;
  VmaMutexLockRead *in_stack_fffffffffffffff0;
  
  VmaMutexLockRead::VmaMutexLockRead
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
             SUB41((uint)in_stack_ffffffffffffffe4 >> 0x18,0));
  bVar1 = VmaIntrusiveLinkedList<VmaDedicatedAllocationListItemTraits>::IsEmpty
                    ((VmaIntrusiveLinkedList<VmaDedicatedAllocationListItemTraits> *)(in_RDI + 0x40)
                    );
  uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffe0);
  VmaMutexLockRead::~VmaMutexLockRead((VmaMutexLockRead *)CONCAT44(in_stack_ffffffffffffffe4,uVar2))
  ;
  return (bool)((byte)((uint)uVar2 >> 0x18) & 1);
}

Assistant:

bool VmaDedicatedAllocationList::IsEmpty()
{
    VmaMutexLockRead lock(m_Mutex, m_UseMutex);
    return m_AllocationList.IsEmpty();
}